

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_ldd.c
# Opt level: O0

size_t lddmc_test_ismdd(MDD mdd)

{
  bool bVar1;
  uint8_t uVar2;
  int iVar3;
  uint32_t uVar4;
  mddnode_t pmVar5;
  uint64_t uVar6;
  mddnode_t pmVar7;
  uint32_t next_value;
  mddnode_t n_1;
  uint32_t value;
  mddnode_t n;
  size_t depth;
  MDD MStack_18;
  int first;
  MDD mdd_local;
  
  if (mdd == 1) {
    mdd_local = 1;
  }
  else if (mdd == 0) {
    mdd_local = 0;
  }
  else {
    bVar1 = true;
    n = (mddnode_t)0x0;
    MStack_18 = mdd;
    if (mdd != 0) {
      pmVar5 = LDD_GETNODE(mdd);
      uVar2 = mddnode_getcopy(pmVar5);
      if (uVar2 != '\0') {
        MStack_18 = mddnode_getright(pmVar5);
        uVar6 = mddnode_getdown(pmVar5);
        n = (mddnode_t)lddmc_test_ismdd(uVar6);
        if (n == (mddnode_t)0x0) {
          __assert_fail("depth >= 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sylvan_ldd.c"
                        ,0xa7d,"size_t lddmc_test_ismdd(MDD)");
        }
      }
    }
    n_1._4_4_ = 0;
    while (MStack_18 != 0) {
      iVar3 = llmsset_is_marked(nodes,MStack_18);
      if (iVar3 == 0) {
        __assert_fail("llmsset_is_marked(nodes, mdd)",
                      "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sylvan_ldd.c"
                      ,0xa83,"size_t lddmc_test_ismdd(MDD)");
      }
      pmVar5 = LDD_GETNODE(MStack_18);
      uVar4 = mddnode_getvalue(pmVar5);
      uVar2 = mddnode_getcopy(pmVar5);
      if (uVar2 != '\0') {
        __assert_fail("mddnode_getcopy(n) == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sylvan_ldd.c"
                      ,0xa87,"size_t lddmc_test_ismdd(MDD)");
      }
      if (bVar1) {
        bVar1 = false;
        uVar6 = mddnode_getdown(pmVar5);
        n = (mddnode_t)lddmc_test_ismdd(uVar6);
        if (n == (mddnode_t)0x0) {
          __assert_fail("depth >= 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sylvan_ldd.c"
                        ,0xa8b,"size_t lddmc_test_ismdd(MDD)");
        }
      }
      else {
        if (uVar4 <= n_1._4_4_) {
          __assert_fail("value < next_value",
                        "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sylvan_ldd.c"
                        ,0xa8d,"size_t lddmc_test_ismdd(MDD)");
        }
        uVar6 = mddnode_getdown(pmVar5);
        pmVar7 = (mddnode_t)lddmc_test_ismdd(uVar6);
        if (n != pmVar7) {
          __assert_fail("depth == lddmc_test_ismdd(mddnode_getdown(n))",
                        "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sylvan_ldd.c"
                        ,0xa8e,"size_t lddmc_test_ismdd(MDD)");
        }
      }
      MStack_18 = mddnode_getright(pmVar5);
      n_1._4_4_ = uVar4;
    }
    mdd_local = (long)&n->a + 1;
  }
  return mdd_local;
}

Assistant:

size_t
lddmc_test_ismdd(MDD mdd)
{
    if (mdd == lddmc_true) return 1;
    if (mdd == lddmc_false) return 0;

    int first = 1;
    size_t depth = 0;

    if (mdd != lddmc_false) {
        mddnode_t n = LDD_GETNODE(mdd);
        if (mddnode_getcopy(n)) {
            mdd = mddnode_getright(n);
            depth = lddmc_test_ismdd(mddnode_getdown(n));
            assert(depth >= 1);
        }
    }

    uint32_t value = 0;
    while (mdd != lddmc_false) {
        assert(llmsset_is_marked(nodes, mdd));

        mddnode_t n = LDD_GETNODE(mdd);
        uint32_t next_value = mddnode_getvalue(n);
        assert(mddnode_getcopy(n) == 0);
        if (first) {
            first = 0;
            depth = lddmc_test_ismdd(mddnode_getdown(n));
            assert(depth >= 1);
        } else {
            assert(value < next_value);
            assert(depth == lddmc_test_ismdd(mddnode_getdown(n)));
        }

        value = next_value;
        mdd = mddnode_getright(n);
    }

    return 1 + depth;
}